

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

void __thiscall MockNamedValueList::add(MockNamedValueList *this,MockNamedValue *newValue)

{
  MockNamedValueListNode *this_00;
  MockNamedValueListNode *pMVar1;
  MockNamedValueListNode *local_38;
  MockNamedValueListNode *lastNode;
  MockNamedValueListNode *newNode;
  MockNamedValue *newValue_local;
  MockNamedValueList *this_local;
  
  this_00 = (MockNamedValueListNode *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
                         ,0x242);
  MockNamedValueListNode::MockNamedValueListNode(this_00,newValue);
  if (this->head_ == (MockNamedValueListNode *)0x0) {
    this->head_ = this_00;
  }
  else {
    local_38 = this->head_;
    while( true ) {
      pMVar1 = MockNamedValueListNode::next(local_38);
      if (pMVar1 == (MockNamedValueListNode *)0x0) break;
      local_38 = MockNamedValueListNode::next(local_38);
    }
    MockNamedValueListNode::setNext(local_38,this_00);
  }
  return;
}

Assistant:

void MockNamedValueList::add(MockNamedValue* newValue)
{
    MockNamedValueListNode* newNode = new MockNamedValueListNode(newValue);
    if (head_ == NULLPTR)
        head_ = newNode;
    else {
        MockNamedValueListNode* lastNode = head_;
        while (lastNode->next()) lastNode = lastNode->next();
        lastNode->setNext(newNode);
    }
}